

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O3

diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
 __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
::
visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
          (traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
           *this,index_pointer node,uint shifts,
          diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
          out)

{
  indent ind;
  database *db;
  ostream *os;
  string_mapping *strings;
  hash_type hVar1;
  uint128 d;
  uint uVar2;
  ostream_base *os_00;
  diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
  __n;
  undefined4 in_register_00000014;
  void *__buf;
  void *__buf_00;
  long lVar3;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> this_00;
  undefined1 local_88 [32];
  __uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_68;
  index_pointer local_60;
  ostream_base *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  address local_48;
  element_type *peStack_40;
  
  if (((ulong)node.internal_ & 1) == 0) {
    if (((ulong)node.internal_ & 2) != 0) {
      assert_failed("node.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                    ,0x62);
    }
    if (*(internal_node **)(this + 0x10) <= node.internal_) {
      local_68._M_t.
      super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
      .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
           (tuple<pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
            )(out.fn_)->db;
      __n.fn_ = out.fn_;
      local_60 = node;
      serialize::
      read<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>,pstore::serialize::archive::database_reader>
                ((pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)local_88,
                 (serialize *)&local_68,(database_reader *)CONCAT44(in_register_00000014,shifts));
      local_58 = (ostream_base *)local_88._0_8_;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
      local_48.a_ = local_88._16_8_;
      peStack_40 = (element_type *)local_88._24_8_;
      os_00 = (ostream_base *)
              exchange::export_ns::ostream_base::write
                        (&(out.fn_)->os->super_ostream_base,(int)*(out.fn_)->fragment_sep,__buf,
                         (size_t)__n.fn_);
      exchange::export_ns::operator<<(os_00,(out.fn_)->ind);
      d.v_._8_8_ = in_stack_ffffffffffffff60;
      d.v_._0_8_ = in_stack_ffffffffffffff58;
      exchange::export_ns::emit_digest((export_ns *)(out.fn_)->os,local_58,d);
      exchange::export_ns::ostream_base::write
                (&(out.fn_)->os->super_ostream_base,0x3a,__buf_00,(size_t)__n.fn_);
      db = (out.fn_)->db;
      os = (out.fn_)->os;
      ind.distance_ = (out.fn_)->ind->distance_;
      strings = (out.fn_)->strings;
      database::getro<pstore::repo::fragment,void>
                ((database *)local_88,(extent<pstore::repo::fragment> *)db);
      exchange::export_ns::emit_fragment
                (&os->super_ostream_base,ind,db,strings,
                 (shared_ptr<const_pstore::repo::fragment> *)local_88,*(out.fn_)->comments);
      if ((_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)local_88._8_8_ !=
          (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      *(out.fn_)->fragment_sep = ",\n";
    }
  }
  else {
    if (shifts < 0x42) {
      index::details::internal_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                  *)local_88,*(database **)this,node);
      if (local_88._16_8_ == 0) {
        assert_failed("std::get<Node const *> (p) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                      ,0x7d);
      }
      uVar2 = index::details::internal_node::size((internal_node *)local_88._16_8_);
      this_00._M_head_impl = (array<pstore::sat_entry,_65536UL> *)local_88._8_8_;
      if (uVar2 != 0) {
        lVar3 = 0;
        do {
          if ((((ulong)node.internal_ & 2) != 0) ||
             (*(ulong *)(this + 0x10) <= ((ulong)node.internal_ & 0xfffffffffffffffc))) {
            out = visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                            (this,*(index_pointer *)((long)(local_88._16_8_ + 0x10) + lVar3),
                             shifts + 6,out);
          }
          lVar3 = lVar3 + 8;
        } while ((ulong)uVar2 << 3 != lVar3);
      }
    }
    else {
      index::details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)local_88,*(database **)this,node);
      if (local_88._16_8_ == 0) {
        assert_failed("std::get<Node const *> (p) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                      ,0x7d);
      }
      hVar1 = *(hash_type *)(local_88._16_8_ + 8);
      this_00._M_head_impl = (array<pstore::sat_entry,_65536UL> *)local_88._8_8_;
      if (hVar1 != 0) {
        lVar3 = 0;
        do {
          if ((((ulong)node.internal_ & 2) != 0) ||
             (*(ulong *)(this + 0x10) <= ((ulong)node.internal_ & 0xfffffffffffffffc))) {
            out = visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                            (this,*(index_pointer *)((long)(local_88._16_8_ + 0x10) + lVar3),
                             shifts + 6,out);
          }
          lVar3 = lVar3 + 8;
        } while (hVar1 << 3 != lVar3);
      }
    }
    if (this_00._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_head_impl);
    }
  }
  return (diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
          )out.fn_;
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }